

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O2

ptr_t __thiscall
aeron::util::MemoryMappedFile::mapExisting
          (MemoryMappedFile *this,char *filename,off_t offset,size_t length)

{
  FileHandle fd_00;
  long *plVar1;
  MemoryMappedFile *this_00;
  IOException *this_01;
  char *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr_t pVar3;
  allocator local_b7;
  allocator local_b6;
  allocator local_b5;
  FileHandle fd;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  fd_00.handle = open64(filename,2,0x1b6);
  fd.handle = fd_00.handle;
  if (-1 < fd_00.handle) {
    plVar1 = (long *)operator_new(0x10);
    *plVar1 = (long)&PTR__FuncHolder_0016fbd0;
    plVar1[1] = (long)&fd;
    this_00 = (MemoryMappedFile *)operator_new(0x10);
    MemoryMappedFile(this_00,fd_00,offset,length);
    std::__shared_ptr<aeron::util::MemoryMappedFile,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<aeron::util::MemoryMappedFile,void>
              ((__shared_ptr<aeron::util::MemoryMappedFile,(__gnu_cxx::_Lock_policy)2> *)this,
               this_00);
    (**(code **)(*plVar1 + 8))(plVar1);
    pVar3.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    pVar3.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (ptr_t)pVar3.
                  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_70,"failed to open existing file: ",&local_b5);
  std::operator+(&local_50,&local_70,filename);
  std::__cxx11::string::string
            ((string *)&local_90,
             "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::mapExisting(const char *, off_t, size_t)"
             ,&local_b6);
  pcVar2 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                      );
  std::__cxx11::string::string((string *)&local_b0,pcVar2,&local_b7);
  IOException::IOException(this_01,&local_50,&local_90,&local_b0,0x96);
  __cxa_throw(this_01,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::mapExisting(const char *filename, off_t offset, size_t length)
{
    FileHandle fd;
    fd.handle = ::open(filename, O_RDWR, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to open existing file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, length));
}